

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-generated-function-mockers.h
# Opt level: O1

MockSpec<int_(int,_int)> * __thiscall
testing::internal::FunctionMocker<int_(int,_int)>::With
          (FunctionMocker<int_(int,_int)> *this,Matcher<int> *m1,Matcher<int> *m2)

{
  linked_ptr<const_testing::MatcherInterface<int>_> *ptr;
  linked_ptr<const_testing::MatcherInterface<int>_> *ptr_00;
  _Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_> local_50;
  
  std::_Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>::_Tuple_impl(&local_50,m1,m2)
  ;
  ptr = &local_50.super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.
         super_MatcherBase<int>.impl_;
  linked_ptr<const_testing::MatcherInterface<int>_>::operator=
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             ((long)&(this->super_FunctionMockerBase<int_(int,_int)>).current_spec_.matchers_.
                     super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
                     super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.
                     super_MatcherBase<int> + 8),ptr);
  ptr_00 = &local_50.super__Tuple_impl<1UL,_testing::Matcher<int>_>.
            super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
            impl_;
  linked_ptr<const_testing::MatcherInterface<int>_>::operator=
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             ((long)&(this->super_FunctionMockerBase<int_(int,_int)>).current_spec_.matchers_.
                     super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
                     super__Tuple_impl<1UL,_testing::Matcher<int>_>.
                     super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl + 8),ptr_00);
  local_50.super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0017a8f8;
  linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr(ptr);
  local_50.super__Tuple_impl<1UL,_testing::Matcher<int>_>.
  super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0017a8f8;
  linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr(ptr_00);
  return &(this->super_FunctionMockerBase<int_(int,_int)>).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1, const Matcher<A2>& m2) {
    this->current_spec().SetMatchers(::testing::make_tuple(m1, m2));
    return this->current_spec();
  }